

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

void SZIP_closeArchive(void *opaque)

{
  SZIPinfo *info;
  void *opaque_local;
  
  if (opaque != (void *)0x0) {
    if (*(long *)((long)opaque + 0x20) != 0) {
      (**(code **)(*(long *)((long)opaque + 0x20) + 0x48))(*(undefined8 *)((long)opaque + 0x20));
    }
    SzArEx_Free((CSzArEx *)((long)opaque + 0x28),&SZIP_SzAlloc);
    __PHYSFS_DirTreeDeinit((__PHYSFS_DirTree *)opaque);
    (*__PHYSFS_AllocatorHooks.Free)(opaque);
  }
  return;
}

Assistant:

static void SZIP_closeArchive(void *opaque)
{
    SZIPinfo *info = (SZIPinfo *) opaque;
    if (info)
    {
        if (info->io)
            info->io->destroy(info->io);
        SzArEx_Free(&info->db, &SZIP_SzAlloc);
        __PHYSFS_DirTreeDeinit(&info->tree);
        allocator.Free(info);
    } /* if */
}